

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.h
# Opt level: O0

int __thiscall HashMap<int>::init(HashMap<int> *this,EVP_PKEY_CTX *ctx)

{
  Node **ppNVar1;
  HashMap<int> *this_local;
  
  if (this->entries == (Node **)0x0) {
    if (this->allocator == (Allocator *)0x0) {
      ppNVar1 = NULLC::construct<HashMap<int>::Node*>(0x400);
      this->entries = ppNVar1;
    }
    else {
      ppNVar1 = Allocator::construct<HashMap<int>::Node*>(this->allocator,0x400);
      this->entries = ppNVar1;
    }
    this = (HashMap<int> *)memset(this->entries,0,0x2000);
  }
  return (int)this;
}

Assistant:

void init()
	{
		if(!entries)
		{
			if(allocator)
				entries = allocator->construct<Node*>(bucketCount);
			else
				entries = NULLC::construct<Node*>(bucketCount);

			memset(entries, 0, sizeof(Node*) * bucketCount);
		}
	}